

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

RPCHelpMan * getblockfilter(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff588;
  RPCArg *this;
  UniValue *in_stack_fffffffffffff590;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5a0;
  BlockFilterType in_stack_fffffffffffff5af;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5c0;
  UniValue *in_stack_fffffffffffff5c8;
  iterator in_stack_fffffffffffff5d0;
  RPCArgOptions *in_stack_fffffffffffff5d8;
  string *in_stack_fffffffffffff5e0;
  undefined7 in_stack_fffffffffffff5e8;
  undefined1 in_stack_fffffffffffff5ef;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff5f0;
  string *in_stack_fffffffffffff5f8;
  undefined1 *puVar2;
  RPCArg *in_stack_fffffffffffff600;
  RPCResults *in_stack_fffffffffffff608;
  RPCResult *in_stack_fffffffffffff610;
  pointer *local_9e8;
  RPCExamples *examples;
  RPCHelpMan *args;
  string *description;
  undefined7 in_stack_fffffffffffff6f0;
  undefined1 uVar3;
  RPCHelpMan *this_00;
  allocator<char> local_88d;
  allocator<char> local_88c;
  allocator<char> local_88b;
  allocator<char> local_88a [2];
  pointer local_888;
  pointer pRStack_880;
  pointer local_878;
  allocator<char> local_86a;
  allocator<char> local_869 [39];
  allocator<char> local_842;
  allocator<char> local_841 [31];
  allocator<char> local_822;
  allocator<char> local_821 [17];
  _Alloc_hider in_stack_fffffffffffff7f0;
  allocator<char> local_803;
  allocator<char> local_802;
  allocator<char> local_801;
  undefined1 local_800 [38];
  RPCExamples local_7da [12];
  undefined1 local_658 [136];
  RPCHelpMan local_5d0;
  undefined1 local_480;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined1 local_440;
  undefined1 local_43f;
  undefined1 local_340;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined1 local_300;
  undefined1 local_2ff;
  undefined1 local_258 [528];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  description = (string *)((long)&local_7da[0].m_examples._M_dataplus._M_p + 1);
  args = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5d8,(char *)in_stack_fffffffffffff5d0,
             (allocator<char> *)in_stack_fffffffffffff5c8);
  examples = local_7da;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5d8,(char *)in_stack_fffffffffffff5d0,
             (allocator<char> *)in_stack_fffffffffffff5c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5d8,(char *)in_stack_fffffffffffff5d0,
             (allocator<char> *)in_stack_fffffffffffff5c8);
  local_800._0_4_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff598,&in_stack_fffffffffffff590->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5d8,(char *)in_stack_fffffffffffff5d0,
             (allocator<char> *)in_stack_fffffffffffff5c8);
  local_340 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff5a0);
  local_318 = 0;
  uStack_310 = 0;
  local_308 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff588);
  local_300 = 0;
  local_2ff = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                 (Type)((ulong)in_stack_fffffffffffff5f0 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff5ef,in_stack_fffffffffffff5e8),
                 in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5d8,(char *)in_stack_fffffffffffff5d0,
             (allocator<char> *)in_stack_fffffffffffff5c8);
  BlockFilterTypeName_abi_cxx11_(in_stack_fffffffffffff5af);
  UniValue::
  UniValue<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff598,in_stack_fffffffffffff590);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5d8,(char *)in_stack_fffffffffffff5d0,
             (allocator<char> *)in_stack_fffffffffffff5c8);
  local_480 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff5a0);
  local_458 = 0;
  uStack_450 = 0;
  local_448 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff588);
  local_440 = 0;
  local_43f = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                 (Type)((ulong)in_stack_fffffffffffff5f0 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff5ef,in_stack_fffffffffffff5e8),
                 in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_fffffffffffff588);
  __l._M_len = (size_type)in_stack_fffffffffffff5d8;
  __l._M_array = in_stack_fffffffffffff5d0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff5c8,__l,
             (allocator_type *)in_stack_fffffffffffff5c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5d8,(char *)in_stack_fffffffffffff5d0,
             (allocator<char> *)in_stack_fffffffffffff5c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5d8,(char *)in_stack_fffffffffffff5d0,
             (allocator<char> *)in_stack_fffffffffffff5c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5d8,(char *)in_stack_fffffffffffff5d0,
             (allocator<char> *)in_stack_fffffffffffff5c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5d8,(char *)in_stack_fffffffffffff5d0,
             (allocator<char> *)in_stack_fffffffffffff5c8);
  local_869[1] = (allocator<char>)0x0;
  local_869[2] = (allocator<char>)0x0;
  local_869[3] = (allocator<char>)0x0;
  local_869[4] = (allocator<char>)0x0;
  local_869[5] = (allocator<char>)0x0;
  local_869[6] = (allocator<char>)0x0;
  local_869[7] = (allocator<char>)0x0;
  local_869[8] = (allocator<char>)0x0;
  local_869[9] = (allocator<char>)0x0;
  local_869[10] = (allocator<char>)0x0;
  local_869[0xb] = (allocator<char>)0x0;
  local_869[0xc] = (allocator<char>)0x0;
  local_869[0xd] = (allocator<char>)0x0;
  local_869[0xe] = (allocator<char>)0x0;
  local_869[0xf] = (allocator<char>)0x0;
  local_869[0x10] = (allocator<char>)0x0;
  local_869[0x11] = (allocator<char>)0x0;
  local_869[0x12] = (allocator<char>)0x0;
  local_869[0x13] = (allocator<char>)0x0;
  local_869[0x14] = (allocator<char>)0x0;
  local_869[0x15] = (allocator<char>)0x0;
  local_869[0x16] = (allocator<char>)0x0;
  local_869[0x17] = (allocator<char>)0x0;
  local_869[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff588);
  RPCResult::RPCResult
            (in_stack_fffffffffffff610,(Type)((ulong)in_stack_fffffffffffff608 >> 0x20),
             &in_stack_fffffffffffff600->m_names,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0
             ,(bool)in_stack_fffffffffffff5ef);
  this_00 = &local_5d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5d8,(char *)in_stack_fffffffffffff5d0,
             (allocator<char> *)in_stack_fffffffffffff5c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5d8,(char *)in_stack_fffffffffffff5d0,
             (allocator<char> *)in_stack_fffffffffffff5c8);
  local_888 = (pointer)0x0;
  pRStack_880 = (pointer)0x0;
  local_878 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff588);
  RPCResult::RPCResult
            (in_stack_fffffffffffff610,(Type)((ulong)in_stack_fffffffffffff608 >> 0x20),
             &in_stack_fffffffffffff600->m_names,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0
             ,(bool)in_stack_fffffffffffff5ef);
  uVar3 = 0;
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff588);
  __l_00._M_len = (size_type)in_stack_fffffffffffff5d8;
  __l_00._M_array = (iterator)in_stack_fffffffffffff5d0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff5c8,__l_00,
             (allocator_type *)in_stack_fffffffffffff5c0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff610,(Type)((ulong)in_stack_fffffffffffff608 >> 0x20),
             &in_stack_fffffffffffff600->m_names,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0
             ,(bool)in_stack_fffffffffffff5ef);
  RPCResults::RPCResults(in_stack_fffffffffffff608,(RPCResult *)in_stack_fffffffffffff600);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5d8,(char *)in_stack_fffffffffffff5d0,
             (allocator<char> *)in_stack_fffffffffffff5c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5d8,(char *)in_stack_fffffffffffff5d0,
             (allocator<char> *)in_stack_fffffffffffff5c8);
  HelpExampleCli(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5d8,(char *)in_stack_fffffffffffff5d0,
             (allocator<char> *)in_stack_fffffffffffff5c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5d8,(char *)in_stack_fffffffffffff5d0,
             (allocator<char> *)in_stack_fffffffffffff5c8);
  HelpExampleRpc(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  std::operator+(in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff588,(string *)0x12984fa);
  this = (RPCArg *)&stack0xfffffffffffff750;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getblockfilter()::__0,void>
            (in_stack_fffffffffffff598,(anon_class_1_0_00000001 *)in_stack_fffffffffffff590);
  RPCHelpMan::RPCHelpMan
            (this_00,(string *)CONCAT17(uVar3,in_stack_fffffffffffff6f0),description,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)args,(RPCResults *)in_RDI,examples,
             (RPCMethodImpl *)in_stack_fffffffffffff7f0._M_p);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_88d);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_88c);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_88b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_88a);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff598);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar2 = local_658;
  local_9e8 = (pointer *)
              ((long)&local_5d0.m_results.m_results.
                      super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                      super__Vector_impl_data + 0x10);
  do {
    local_9e8 = local_9e8 + -0x11;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_9e8 != (pointer *)puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff598);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_86a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_869);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff598);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_842);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_841);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_822);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_821);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff598);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_258;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_803);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_802);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_801);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_800 + 7));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_7da);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&local_7da[0].m_examples._M_dataplus._M_p + 1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return args;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getblockfilter()
{
    return RPCHelpMan{"getblockfilter",
                "\nRetrieve a BIP 157 content filter for a particular block.\n",
                {
                    {"blockhash", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The hash of the block"},
                    {"filtertype", RPCArg::Type::STR, RPCArg::Default{BlockFilterTypeName(BlockFilterType::BASIC)}, "The type name of the filter"},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR_HEX, "filter", "the hex-encoded filter data"},
                        {RPCResult::Type::STR_HEX, "header", "the hex-encoded filter header"},
                    }},
                RPCExamples{
                    HelpExampleCli("getblockfilter", "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\" \"basic\"") +
                    HelpExampleRpc("getblockfilter", "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\", \"basic\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    uint256 block_hash = ParseHashV(request.params[0], "blockhash");
    std::string filtertype_name = BlockFilterTypeName(BlockFilterType::BASIC);
    if (!request.params[1].isNull()) {
        filtertype_name = request.params[1].get_str();
    }

    BlockFilterType filtertype;
    if (!BlockFilterTypeByName(filtertype_name, filtertype)) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Unknown filtertype");
    }

    BlockFilterIndex* index = GetBlockFilterIndex(filtertype);
    if (!index) {
        throw JSONRPCError(RPC_MISC_ERROR, "Index is not enabled for filtertype " + filtertype_name);
    }

    const CBlockIndex* block_index;
    bool block_was_connected;
    {
        ChainstateManager& chainman = EnsureAnyChainman(request.context);
        LOCK(cs_main);
        block_index = chainman.m_blockman.LookupBlockIndex(block_hash);
        if (!block_index) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block not found");
        }
        block_was_connected = block_index->IsValid(BLOCK_VALID_SCRIPTS);
    }

    bool index_ready = index->BlockUntilSyncedToCurrentChain();

    BlockFilter filter;
    uint256 filter_header;
    if (!index->LookupFilter(block_index, filter) ||
        !index->LookupFilterHeader(block_index, filter_header)) {
        int err_code;
        std::string errmsg = "Filter not found.";

        if (!block_was_connected) {
            err_code = RPC_INVALID_ADDRESS_OR_KEY;
            errmsg += " Block was not connected to active chain.";
        } else if (!index_ready) {
            err_code = RPC_MISC_ERROR;
            errmsg += " Block filters are still in the process of being indexed.";
        } else {
            err_code = RPC_INTERNAL_ERROR;
            errmsg += " This error is unexpected and indicates index corruption.";
        }

        throw JSONRPCError(err_code, errmsg);
    }

    UniValue ret(UniValue::VOBJ);
    ret.pushKV("filter", HexStr(filter.GetEncodedFilter()));
    ret.pushKV("header", filter_header.GetHex());
    return ret;
},
    };
}